

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O1

void incdec_verify::PreIncTestUint32(void)

{
  bool expected;
  uint t;
  long lVar1;
  string local_50;
  
  lVar1 = 8;
  do {
    t = *(uint *)(&UNK_0014d4c8 + lVar1);
    if (t == 0xffffffff) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
    expected = *(bool *)((long)&inc_uint32 + lVar1);
    if ((t + 1 == *(int *)(&UNK_0014d4cc + lVar1)) != expected) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Error in case inc_uint32 throw (1): ","");
      err_msg<unsigned_int>(&local_50,t,expected);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    lVar1 = lVar1 + 0xc;
  } while (lVar1 != 0x74);
  return;
}

Assistant:

void PreIncTestUint32()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_uint32); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt<std::uint32_t> si(inc_uint32[i].x);
			SafeInt<std::uint32_t> vv = ++si;

			if(vv != inc_uint32[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_uint32[i].fExpected )
		{
			err_msg( "Error in case inc_uint32 throw (1): ", inc_uint32[i].x, inc_uint32[i].fExpected );
		}
	}
}